

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall ieee754::round_up(ieee754 *this)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  ieee754 *in_RDI;
  int b;
  uchar mask;
  int i;
  int imsb;
  int local_18;
  
  iVar2 = mantissa_msb_index(in_RDI);
  local_18 = 0;
  while( true ) {
    if (iVar2 <= local_18) {
      bVar1 = mantissa_msb_mask(in_RDI);
      bVar3 = in_RDI->buf[iVar2] + 1 & bVar1;
      in_RDI->buf[iVar2] = in_RDI->buf[iVar2] & (bVar1 ^ 0xff);
      in_RDI->buf[iVar2] = in_RDI->buf[iVar2] | bVar3;
      return (uint)(bVar3 == 0);
    }
    if (in_RDI->buf[local_18] != 0xff) break;
    in_RDI->buf[local_18] = '\0';
    local_18 = local_18 + 1;
  }
  in_RDI->buf[local_18] = in_RDI->buf[local_18] + '\x01';
  return 0;
}

Assistant:

int round_up()
    {
        /* add to the low byte, and carry as needed to whole bytes */
        int imsb = mantissa_msb_index();
        for (int i = 0 ; i < imsb ; ++i)
        {
            if (buf[i] == 0xff)
            {
                /* this overflows the byte - zero it and carry to the next */
                buf[i] = 0;
            }
            else
            {
                /* no overflow - increment this byte and return "no carry" */
                buf[i] += 1;
                return FALSE;
            }
        }
        
        /* 
         *   if we got this far, we've carried into the most significant
         *   byte, which is a partial byte - we need to use the msb bit mask
         *   for this arithmetic 
         */
        unsigned char mask = mantissa_msb_mask();
        int b = (buf[imsb] + 1) & mask;
        buf[imsb] &= ~mask;
        buf[imsb] |= b;

        /* if we wrapped that to zero, we carried into the implied lead bit */
        return (b == 0);
    }